

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testServerBuffering.cpp
# Opt level: O0

string * trim_newline(string *__return_storage_ptr__,string *_buffer)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  string *_buffer_local;
  string *buffer;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_buffer);
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar3 = false;
    if ((uVar1 & 1) == 0) {
      pcVar2 = (char *)std::__cxx11::string::back();
      bVar3 = true;
      if (*pcVar2 != '\n') {
        pcVar2 = (char *)std::__cxx11::string::back();
        bVar3 = *pcVar2 == '\r';
      }
    }
    if (!bVar3) break;
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim_newline(const std::string& _buffer)
{
  auto buffer = _buffer;
  while (!buffer.empty() && (buffer.back() == '\n' || buffer.back() == '\r')) {
    buffer.pop_back();
  }
  return buffer;
}